

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O1

HANDLE CreateEventW(LPSECURITY_ATTRIBUTES lpEventAttributes,BOOL bManualReset,BOOL bInitialState,
                   LPCWSTR lpName)

{
  PAL_ERROR PVar1;
  CPalThread *pthr;
  PAL_ERROR *pPVar2;
  HANDLE local_38;
  HANDLE hEvent;
  
  local_38 = (HANDLE)0x0;
  if (PAL_InitializeChakraCoreCalled) {
    pthr = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
    if (pthr == (CPalThread *)0x0) {
      pthr = CreateCurrentThreadData();
    }
    PVar1 = CorUnix::InternalCreateEvent
                      (pthr,lpEventAttributes,bManualReset,bInitialState,lpName,&local_38);
    pPVar2 = (PAL_ERROR *)__errno_location();
    *pPVar2 = PVar1;
    if (PAL_InitializeChakraCoreCalled != false) {
      return local_38;
    }
  }
  abort();
}

Assistant:

HANDLE
PALAPI
CreateEventW(
         IN LPSECURITY_ATTRIBUTES lpEventAttributes,
         IN BOOL bManualReset,
         IN BOOL bInitialState,
         IN LPCWSTR lpName)
{
    HANDLE hEvent = NULL;
    PAL_ERROR palError;
    CPalThread *pthr = NULL;

    PERF_ENTRY(CreateEventW);
    ENTRY("CreateEventW(lpEventAttr=%p, bManualReset=%d, "
          "bInitialState=%d, lpName=%p (%S)\n", lpEventAttributes, bManualReset, 
           bInitialState, lpName, lpName?lpName:W16_NULLSTRING);

    pthr = InternalGetCurrentThread();

    palError = InternalCreateEvent(
        pthr,
        lpEventAttributes, 
        bManualReset,
        bInitialState,
        lpName,
        &hEvent
        );

    //
    // We always need to set last error, even on success:
    // we need to protect ourselves from the situation
    // where last error is set to ERROR_ALREADY_EXISTS on
    // entry to the function
    //

    pthr->SetLastError(palError);

    LOGEXIT("CreateEventW returns HANDLE %p\n", hEvent);
    PERF_EXIT(CreateEventW);
    return hEvent;
}